

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O2

void fl_fix_focus(void)

{
  int iVar1;
  int iVar2;
  Fl_Window *this;
  Fl_Window *pFVar3;
  
  iVar2 = Fl::e_keysym;
  if (Fl::grab_ == (Fl_Window *)0x0) {
    if (fl_xfocus == (Fl_Window *)0x0) {
      Fl::focus((Fl_Widget *)0x0);
      iVar2 = Fl::e_keysym;
    }
    else {
      pFVar3 = fl_xfocus;
      if (Fl::e_keysym - 0xfeecU < 0xfffffffd) {
        Fl::e_keysym = 0;
      }
      do {
        this = pFVar3;
        pFVar3 = (Fl_Window *)(this->super_Fl_Group).super_Fl_Widget.parent_;
      } while (pFVar3 != (Fl_Window *)0x0);
      if (Fl::modal_ != (Fl_Window *)0x0) {
        this = Fl::modal_;
      }
      iVar1 = Fl_Widget::contains((Fl_Widget *)this,Fl::focus_);
      if ((iVar1 == 0) && (iVar1 = Fl_Widget::take_focus((Fl_Widget *)this), iVar1 == 0)) {
        Fl::focus((Fl_Widget *)this);
      }
    }
    Fl::e_keysym = iVar2;
    if (Fl::pushed_ == (Fl_Widget *)0x0) {
      if (fl_xmousewin == (Fl_Window *)0x0) {
        Fl::belowmouse((Fl_Widget *)0x0);
        (*Fl_Tooltip::enter)((Fl_Widget *)0x0);
        return;
      }
      pFVar3 = fl_xmousewin;
      if (Fl::modal_ != (Fl_Window *)0x0) {
        pFVar3 = Fl::modal_;
      }
      iVar1 = Fl_Widget::contains((Fl_Widget *)pFVar3,Fl::belowmouse_);
      iVar2 = Fl::e_number;
      if (iVar1 == 0) {
        Fl::e_number = 3;
        (*(pFVar3->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[3])(pFVar3,3);
        Fl::e_number = iVar2;
        iVar2 = Fl_Widget::contains((Fl_Widget *)pFVar3,Fl::belowmouse_);
        if (iVar2 == 0) {
          Fl::belowmouse((Fl_Widget *)pFVar3);
          return;
        }
      }
      else {
        Fl::e_x = Fl::e_x_root - (fl_xmousewin->super_Fl_Group).super_Fl_Widget.x_;
        Fl::e_y = Fl::e_y_root - (fl_xmousewin->super_Fl_Group).super_Fl_Widget.y_;
        Fl::e_number = 0xb;
        (*(pFVar3->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[3])(pFVar3,0xb);
        Fl::e_number = iVar2;
      }
    }
  }
  return;
}

Assistant:

void fl_fix_focus() {
#ifdef DEBUG
  puts("fl_fix_focus();");
#endif // DEBUG

  if (Fl::grab()) return; // don't do anything while grab is on.

  // set focus based on Fl::modal() and fl_xfocus
  Fl_Widget* w = fl_xfocus;
  if (w) {
    int saved = Fl::e_keysym;
    if (Fl::e_keysym < (FL_Button + FL_LEFT_MOUSE) ||
        Fl::e_keysym > (FL_Button + FL_RIGHT_MOUSE))
      Fl::e_keysym = 0; // make sure widgets don't think a keystroke moved focus
    while (w->parent()) w = w->parent();
    if (Fl::modal()) w = Fl::modal();
    if (!w->contains(Fl::focus()))
      if (!w->take_focus()) Fl::focus(w);
    Fl::e_keysym = saved;
  } else
    Fl::focus(0);

// MRS: Originally we checked the button state, but a user reported that it
//      broke click-to-focus in FLWM?!?
//  if (!(Fl::event_state() & 0x7f00000 /*FL_BUTTONS*/)) {
  if (!Fl::pushed()) {
    // set belowmouse based on Fl::modal() and fl_xmousewin:
    w = fl_xmousewin;
    if (w) {
      if (Fl::modal()) w = Fl::modal();
      if (!w->contains(Fl::belowmouse())) {
        int old_event = Fl::e_number;
	w->handle(Fl::e_number = FL_ENTER);
	Fl::e_number = old_event;
	if (!w->contains(Fl::belowmouse())) Fl::belowmouse(w);
      } else {
	// send a FL_MOVE event so the enter/leave state is up to date
	Fl::e_x = Fl::e_x_root-fl_xmousewin->x();
	Fl::e_y = Fl::e_y_root-fl_xmousewin->y();
        int old_event = Fl::e_number;
	w->handle(Fl::e_number = FL_MOVE);
	Fl::e_number = old_event;
      }
    } else {
      Fl::belowmouse(0);
      Fl_Tooltip::enter(0);
    }
  }
}